

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::fail_array64_int8_missing_length_seven(void)

{
  value_type input [2];
  decoder decoder;
  uchar local_3a [2];
  undefined4 local_38;
  value local_34;
  decoder local_30;
  
  local_3a[0] = 0xd8;
  local_3a[1] = '\x01';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>(&local_30,&local_3a);
  local_34 = local_30.current.code;
  local_38 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x69d,"void compact_int8_suite::fail_array64_int8_missing_length_seven()",&local_34,
             &local_38);
  return;
}

Assistant:

void fail_array64_int8_missing_length_seven()
{
    const value_type input[] = { token::code::array64_int8, 0x01 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}